

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m2C02.cpp
# Opt level: O0

uint8_t __thiscall m2C02::cpuRead(m2C02 *this,uint16_t addr,bool bReadOnly)

{
  uint8_t uVar1;
  short sVar2;
  byte local_14;
  uint8_t data;
  bool bReadOnly_local;
  uint16_t addr_local;
  m2C02 *this_local;
  
  local_14 = 0;
  if (bReadOnly) {
    switch(addr) {
    case 0:
      local_14 = (this->control).reg;
      break;
    case 1:
      local_14 = (this->mask).reg;
      break;
    case 2:
      local_14 = (this->status).reg;
      break;
    case 3:
      break;
    case 4:
      break;
    case 5:
      break;
    case 6:
      break;
    case 7:
    }
  }
  else {
    switch(addr) {
    case 0:
      break;
    case 1:
      break;
    case 2:
      local_14 = (this->status).reg & 0xe0 | this->ppuDataBuffer & 0x1f;
      (this->status).reg = (this->status).reg & 0x7f;
      this->addressLatch = '\0';
      break;
    case 3:
      break;
    case 4:
      break;
    case 5:
      break;
    case 6:
      break;
    case 7:
      local_14 = this->ppuDataBuffer;
      uVar1 = ppuRead(this,(this->vramAddr).reg,false);
      this->ppuDataBuffer = uVar1;
      if (0x3eff < (this->vramAddr).reg) {
        local_14 = this->ppuDataBuffer;
      }
      sVar2 = 1;
      if (((this->control).reg >> 2 & 1) != 0) {
        sVar2 = 0x20;
      }
      (this->vramAddr).reg = (this->vramAddr).reg + sVar2;
    }
  }
  return local_14;
}

Assistant:

uint8_t m2C02::cpuRead(uint16_t addr, bool bReadOnly) const
{
  uint8_t data = 0x00u;
  if (bReadOnly)
  {
    switch (addr)
    {
    case 0x0000u: // Control
      data = control.reg;
      break;
    case 0x0001u: // Mask
      data = mask.reg;
      break;
    case 0x0002u: // Status
      data = status.reg;
      break;
    case 0x0003u: // OAM Address
      break;
    case 0x0004u: // OAM Data
      break;
    case 0x0005u: // Scroll
      break;
    case 0x0006u: // PPU Address
      break;
    case 0x0007u: // PPU Data
      break;
    default:
      break;
    }
  }
  else
  {
    switch (addr)
    {
    case 0x0000u: // Control
      break;
    case 0x0001u: // Mask
      break;
    case 0x0002u: // Status
      data = (status.reg & 0xE0u) | (ppuDataBuffer & 0x1Fu);
      status.vertical_blank = 0;
      addressLatch = 0;
      break;
    case 0x0003u: // OAM Address
      break;
    case 0x0004u: // OAM Data
      break;
    case 0x0005u: // Scroll
      break;
    case 0x0006u: // PPU Address
      break;
    case 0x0007u: // PPU Data
      data = ppuDataBuffer;
      ppuDataBuffer = ppuRead(vramAddr.reg);

      if (vramAddr.reg >= 0x3F00u)
      {
        data = ppuDataBuffer;
      }
      vramAddr.reg += (control.increment_mode ? 32 : 1);
      break;
    default:
      break;
    }
  }

  return data;
}